

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-as.c
# Opt level: O0

matches * catmatches(matches *a,matches *b)

{
  int iVar1;
  match *pmVar2;
  int local_1c;
  int i;
  matches *b_local;
  matches *a_local;
  
  for (local_1c = 0; local_1c < b->mnum; local_1c = local_1c + 1) {
    if (a->mmax <= a->mnum) {
      if (a->mmax == 0) {
        a->mmax = 0x10;
      }
      else {
        a->mmax = a->mmax << 1;
      }
      pmVar2 = (match *)realloc(a->m,(long)a->mmax * 0xb8);
      a->m = pmVar2;
    }
    iVar1 = a->mnum;
    a->mnum = iVar1 + 1;
    memcpy(a->m + iVar1,b->m + local_1c,0xb8);
  }
  free(b->m);
  free(b);
  return a;
}

Assistant:

struct matches *catmatches(struct matches *a, struct matches *b) {
	int i;
	for (i = 0; i < b->mnum; i++)
		ADDARRAY(a->m, b->m[i]);
	free(b->m);
	free(b);
	return a;
}